

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_uint.h
# Opt level: O3

bool __thiscall
jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>::SetHex
          (base_uint<160UL,_jbcoin::detail::AccountIDTag> *this,char *psz,bool bStrict)

{
  uchar uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  undefined7 in_register_00000011;
  undefined1 *puVar5;
  long lVar6;
  uchar *puVar7;
  uchar *puVar8;
  uchar *puVar9;
  
  if ((int)CONCAT71(in_register_00000011,bStrict) == 0) {
    psz = psz + -1;
    do {
      puVar9 = (uchar *)psz;
      uVar1 = puVar9[1];
      psz = (char *)(puVar9 + 1);
      iVar3 = isspace((int)(char)uVar1);
    } while (iVar3 != 0);
    if (uVar1 == '0') {
      iVar3 = tolower((int)(char)puVar9[2]);
      psz = (char *)((uchar *)psz + (ulong)(iVar3 == 0x78) * 2);
    }
  }
  lVar2 = 0;
  do {
    lVar6 = lVar2;
    iVar3 = charUnHex(((uchar *)psz)[lVar6]);
    lVar2 = lVar6 + 1;
  } while (iVar3 != -1);
  puVar9 = (uchar *)psz + lVar6 + -0x28;
  if ((uint)lVar6 < 0x29) {
    puVar9 = (uchar *)psz;
  }
  puVar5 = (undefined1 *)
           ((long)this + (0x14 - (long)((uchar *)psz + ((lVar6 + 1) - (long)puVar9)) / 2));
  this->pn[0] = 0;
  this->pn[1] = 0;
  this->pn[2] = 0;
  this->pn[3] = 0;
  this->pn[4] = 0;
  puVar7 = (uchar *)psz + lVar6;
  if (((int)((uchar *)psz + ((lVar6 + 1) - (long)puVar9)) - 1U & 1) == 0) goto LAB_001ecd51;
  puVar8 = puVar9 + 1;
  uVar4 = charUnHex(*puVar9);
  while( true ) {
    *puVar5 = (char)uVar4;
    puVar5 = puVar5 + 1;
    puVar9 = puVar8;
LAB_001ecd51:
    if (puVar7 == puVar9) {
      return *puVar7 == '\0';
    }
    puVar8 = puVar9 + 1;
    iVar3 = charUnHex(*puVar9);
    if (puVar7 == puVar8) {
      uVar4 = 0;
    }
    else {
      puVar8 = puVar9 + 2;
      uVar4 = charUnHex(puVar9[1]);
    }
    if (iVar3 == -1) break;
    if (uVar4 == 0xffffffff) {
      return false;
    }
    uVar4 = uVar4 | iVar3 << 4;
  }
  return false;
}

Assistant:

bool SetHex (const char* psz, bool bStrict = false)
    {
        // skip leading spaces
        if (!bStrict)
            while (isspace (*psz))
                psz++;

        // skip 0x
        if (!bStrict && psz[0] == '0' && tolower (psz[1]) == 'x')
            psz += 2;

        const unsigned char* pEnd   = reinterpret_cast<const unsigned char*> (psz);
        const unsigned char* pBegin = pEnd;

        // Find end.
        while (charUnHex(*pEnd) != -1)
            pEnd++;

        // Take only last digits of over long string.
        if ((unsigned int) (pEnd - pBegin) > 2 * size ())
            pBegin = pEnd - 2 * size ();

        unsigned char* pOut = end () - ((pEnd - pBegin + 1) / 2);

        *this = beast::zero;

        if ((pEnd - pBegin) & 1)
            *pOut++ = charUnHex(*pBegin++);

        while (pBegin != pEnd)
        {
            auto cHigh = charUnHex(*pBegin++);
            auto cLow  = pBegin == pEnd
                            ? 0
                            : charUnHex(*pBegin++);

            if (cHigh == -1 || cLow == -1)
                return false;

            *pOut++ = (cHigh << 4) | cLow;
        }

        return !*pEnd;
    }